

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.h
# Opt level: O0

void __thiscall
disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BlockingStrategy,_0>::
~Sequencer(Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BlockingStrategy,_0> *this)

{
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *unaff_retaddr;
  
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~vector(unaff_retaddr)
  ;
  BlockingStrategy::~BlockingStrategy((BlockingStrategy *)0x165980);
  RingBuffer<long,_0>::~RingBuffer((RingBuffer<long,_0> *)0x16598a);
  return;
}

Assistant:

Sequencer(size_t n) : ring_buffer_(n), claim_strategy_(n) {}